

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_variablebyte.cpp
# Opt level: O2

void __thiscall
FastPForLib::VariableByteTest_randomNumbers5000_Test::VariableByteTest_randomNumbers5000_Test
          (VariableByteTest_randomNumbers5000_Test *this)

{
  VariableByteTest::VariableByteTest(&this->super_VariableByteTest);
  (this->super_VariableByteTest).super_Test._vptr_Test =
       (_func_int **)&PTR__VariableByteTest_001a7aa0;
  return;
}

Assistant:

TEST_F(VariableByteTest, randomNumbers5000) {
    in64.resize(0);
    std::mt19937_64 e2(123456);
    std::uniform_int_distribution<int64_t> dist(
                            std::numeric_limits<int64_t>::min(),
                            std::numeric_limits<int64_t>::max());
    for (int i = 0; i < 5000; ++i) {
      in64.push_back(dist(e2));
    }
    _verify64();
  }